

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_bitset_container_intersect(run_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  int local_24;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_1);
  if (_Var1) {
    _Var1 = bitset_container_empty(src_2);
    src_1_local._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  else {
    for (local_24 = 0; local_24 < src_1->n_runs; local_24 = local_24 + 1) {
      _Var1 = bitset_lenrange_empty
                        (src_2->words,(uint)src_1->runs[local_24] & 0xffff,
                         (uint)src_1->runs[local_24] >> 0x10);
      if (!_Var1) {
        return true;
      }
    }
    src_1_local._7_1_ = false;
  }
  return src_1_local._7_1_;
}

Assistant:

bool run_bitset_container_intersect(const run_container_t *src_1,
                                       const bitset_container_t *src_2) {
	   if( run_container_is_full(src_1) ) {
		   return !bitset_container_empty(src_2);
	   }
       for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
           rle16_t rle = src_1->runs[rlepos];
           if(!bitset_lenrange_empty(src_2->words, rle.value,rle.length)) return true;
       }
       return false;
}